

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

Matrix3x3 * CMU462::DynamicScene::rotateMatrix(float ux,float uy,float uz,float theta)

{
  double *pdVar1;
  Matrix3x3 *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  Matrix3x3 *this;
  double dVar5;
  float in_XMM1_Da;
  float in_XMM2_Da;
  uint in_XMM3_Da;
  float s;
  float c;
  Matrix3x3 *out;
  Matrix3x3 *in_stack_ffffffffffffff90;
  Matrix3x3 *in_stack_ffffffffffffffa0;
  
  Matrix3x3::Matrix3x3(in_stack_ffffffffffffffa0);
  dVar4 = std::cos((double)(ulong)in_XMM3_Da);
  fVar2 = SUB84(dVar4,0);
  dVar4 = std::sin((double)(ulong)in_XMM3_Da);
  fVar3 = SUB84(dVar4,0);
  dVar4 = (double)(in_XMM0_Da * in_XMM0_Da * (1.0 - fVar2) + fVar2);
  pdVar1 = Matrix3x3::operator()
                     (in_stack_ffffffffffffff90,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = dVar4;
  this = (Matrix3x3 *)(double)(in_XMM0_Da * in_XMM1_Da * (1.0 - fVar2) + -(in_XMM2_Da * fVar3));
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)this;
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)(in_XMM0_Da * in_XMM2_Da * (1.0 - fVar2) + in_XMM1_Da * fVar3);
  dVar5 = (double)(in_XMM1_Da * in_XMM0_Da * (1.0 - fVar2) + in_XMM2_Da * fVar3);
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = dVar5;
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)(in_XMM1_Da * in_XMM1_Da * (1.0 - fVar2) + fVar2);
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)(in_XMM1_Da * in_XMM2_Da * (1.0 - fVar2) + -(in_XMM0_Da * fVar3));
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)(in_XMM2_Da * in_XMM0_Da * (1.0 - fVar2) + -(in_XMM1_Da * fVar3));
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)(in_XMM2_Da * in_XMM1_Da * (1.0 - fVar2) + in_XMM0_Da * fVar3);
  pdVar1 = Matrix3x3::operator()(this,(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0));
  *pdVar1 = (double)(in_XMM2_Da * in_XMM2_Da * (1.0 - fVar2) + fVar2);
  return in_RDI;
}

Assistant:

Matrix3x3 rotateMatrix(float ux, float uy, float uz, float theta) {
  Matrix3x3 out = Matrix3x3();
  float c = cos(theta);
  float s = sin(theta);
  out(0, 0) = c + ux * ux * (1 - c);
  out(0, 1) = ux * uy * (1 - c) - uz * s;
  out(0, 2) = ux * uz * (1 - c) + uy * s;
  out(1, 0) = uy * ux * (1 - c) + uz * s;
  out(1, 1) = c + uy * uy * (1 - c);
  out(1, 2) = uy * uz * (1 - c) - ux * s;
  out(2, 0) = uz * ux * (1 - c) - uy * s;
  out(2, 1) = uz * uy * (1 - c) + ux * s;
  out(2, 2) = c + uz * uz * (1 - c);
  return out;
}